

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O2

Vector * SSORIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType Dummy,double Omega)

{
  LASErrIdType LVar1;
  Boolean BVar2;
  size_t Dim;
  Vector *pVVar3;
  QMatrix *pQVar4;
  QMatrix *pQVar5;
  QMatrix *pQVar6;
  QMatrix *Q2;
  int iVar7;
  double bNorm;
  double dVar8;
  undefined1 auVar9 [16];
  Vector r;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  iVar7 = 1;
  V_Constr(&r,"r",Dim,Normal,True);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    bNorm = l2Norm_V(b);
    dVar8 = l1Norm_V(x);
    auVar9._8_4_ = (int)(Dim >> 0x20);
    auVar9._0_8_ = Dim;
    auVar9._12_4_ = 0x45300000;
    pVVar3 = b;
    if (2.2250738585072014e-307 <=
        ABS(dVar8 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar3 = Mul_QV(A,x);
      pVVar3 = Sub_VV(b,pVVar3);
    }
    Asgn_VV(&r,pVVar3);
    while( true ) {
      dVar8 = l2Norm_V(&r);
      BVar2 = RTCResult(iVar7 + -1,dVar8,bNorm,SSORIterId);
      if ((BVar2 != False) || (MaxIter <= iVar7 + -1)) break;
      pQVar4 = Diag_Q(A);
      pQVar4 = Mul_SQ(1.0 / Omega,pQVar4);
      pQVar5 = Upper_Q(A);
      pQVar4 = Add_QQ(pQVar4,pQVar5);
      pQVar5 = Diag_Q(A);
      pQVar6 = Diag_Q(A);
      pQVar6 = Mul_SQ(1.0 / Omega,pQVar6);
      Q2 = Lower_Q(A);
      pQVar6 = Add_QQ(pQVar6,Q2);
      pVVar3 = MulInv_QV(pQVar6,&r);
      pVVar3 = Mul_QV(pQVar5,pVVar3);
      pVVar3 = MulInv_QV(pQVar4,pVVar3);
      pVVar3 = Mul_SV((2.0 - Omega) / Omega,pVVar3);
      AddAsgn_VV(x,pVVar3);
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(x,A);
      }
      if (iVar7 < MaxIter) {
        pVVar3 = Mul_QV(A,x);
        pVVar3 = Sub_VV(b,pVVar3);
        Asgn_VV(&r,pVVar3);
      }
      iVar7 = iVar7 + 1;
    }
  }
  V_Destr(&r);
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *SSORIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType Dummy, double Omega)
{
    (void) Dummy;
    
    int Iter;
    double bNorm;
    size_t Dim;
    Vector r;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        while (!RTCResult(Iter, l2Norm_V(&r), bNorm, SSORIterId)
            && Iter < MaxIter) {
            Iter++;
            /* x(i+1) = x(i) + (2 - Omega) * (Diag(A) / Omega + Upper(A))^(-1)
                   * Diag(A) / Omega * (Diag(A) / Omega + Lower(A))^(-1) r */
            AddAsgn_VV(x, Mul_SV((2.0 - Omega) / Omega,
                MulInv_QV(Add_QQ(Mul_SQ(1.0 / Omega, Diag_Q(A)), Upper_Q(A)),
                Mul_QV(Diag_Q(A),
                MulInv_QV(Add_QQ(Mul_SQ(1.0 / Omega, Diag_Q(A)), Lower_Q(A)), &r)))));
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            /* r = b - A * x(i) */
            if (Iter < MaxIter)
                Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        }
    }

    V_Destr(&r);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}